

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcm2835.c
# Opt level: O0

void bcm2835_aux_spi_writenb(char *tbuf,uint32_t len)

{
  uint32_t uVar1;
  uint32_t *paddr;
  uint32_t *paddr_00;
  uint32_t *paddr_01;
  uint32_t *paddr_02;
  uint local_68;
  uint local_64;
  uint32_t _cntl0;
  uint uStack_54;
  uint8_t byte;
  uint32_t i;
  uint32_t data;
  uint32_t count;
  uint32_t tx_len;
  char *tx;
  uint32_t *io;
  uint32_t *txhold;
  uint32_t *stat;
  uint32_t *cntl1;
  uint32_t *cntl0;
  uint32_t len_local;
  char *tbuf_local;
  
  paddr = bcm2835_spi1 + 1;
  paddr_00 = bcm2835_spi1 + 2;
  paddr_01 = bcm2835_spi1 + 0xc;
  paddr_02 = bcm2835_spi1 + 8;
  bcm2835_peri_write(bcm2835_spi1,spi1_speed << 0x14 | 0x64840);
  bcm2835_peri_write(paddr,2);
  data = len;
  _count = (byte *)tbuf;
  while (data != 0) {
    do {
      uVar1 = bcm2835_peri_read(paddr_00);
    } while ((uVar1 & 0x400) != 0);
    if (data < 3) {
      local_64 = data;
    }
    else {
      local_64 = 3;
    }
    uStack_54 = 0;
    for (_cntl0 = 0; _cntl0 < local_64; _cntl0 = _cntl0 + 1) {
      if (_count == (byte *)0x0) {
        local_68 = 0;
      }
      else {
        local_68 = (uint)*_count;
        _count = _count + 1;
      }
      uStack_54 = local_68 << (('\x02' - (char)_cntl0) * '\b' & 0x1fU) | uStack_54;
    }
    uStack_54 = local_64 << 0x1b | uStack_54;
    data = data - local_64;
    if (data == 0) {
      bcm2835_peri_write(paddr_02,uStack_54);
    }
    else {
      bcm2835_peri_write(paddr_01,uStack_54);
    }
    do {
      uVar1 = bcm2835_peri_read(paddr_00);
    } while ((uVar1 & 0x40) != 0);
    bcm2835_peri_read(paddr_02);
  }
  return;
}

Assistant:

void bcm2835_aux_spi_writenb(const char *tbuf, uint32_t len) {
    volatile uint32_t* cntl0 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL0/4;
    volatile uint32_t* cntl1 = bcm2835_spi1 + BCM2835_AUX_SPI_CNTL1/4;
    volatile uint32_t* stat = bcm2835_spi1 + BCM2835_AUX_SPI_STAT/4;
    volatile uint32_t* txhold = bcm2835_spi1 + BCM2835_AUX_SPI_TXHOLD/4;
    volatile uint32_t* io = bcm2835_spi1 + BCM2835_AUX_SPI_IO/4;

    char *tx = (char *) tbuf;
    uint32_t tx_len = len;
    uint32_t count;
    uint32_t data;
    uint32_t i;
    uint8_t byte;

    uint32_t _cntl0 = (spi1_speed << BCM2835_AUX_SPI_CNTL0_SPEED_SHIFT);
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_CS2_N;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_ENABLE;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_MSBF_OUT;
    _cntl0 |= BCM2835_AUX_SPI_CNTL0_VAR_WIDTH;

    bcm2835_peri_write(cntl0, _cntl0);
    bcm2835_peri_write(cntl1, BCM2835_AUX_SPI_CNTL1_MSBF_IN);

    while (tx_len > 0) {

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_TX_FULL)
	    ;

	count = MIN(tx_len, 3);
	data = 0;

	for (i = 0; i < count; i++) {
	    byte = (tx != NULL) ? (uint8_t) *tx++ : (uint8_t) 0;
	    data |= byte << (8 * (2 - i));
	}

	data |= (count * 8) << 24;
	tx_len -= count;

	if (tx_len != 0) {
	    bcm2835_peri_write(txhold, data);
	} else {
	    bcm2835_peri_write(io, data);
	}

	while (bcm2835_peri_read(stat) & BCM2835_AUX_SPI_STAT_BUSY)
	    ;

	(void) bcm2835_peri_read(io);
    }
}